

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasCommit(Canvas *ptr)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int blue;
  int green;
  int red;
  int *pix;
  float *fStart;
  int *pEnd;
  int *pStart;
  Canvas *ptr_local;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    pcVar3 = (ptr->dataI).ptr;
    iVar1 = ptr->width;
    iVar2 = ptr->height;
    pix = (int *)(ptr->data).ptr;
    for (_green = (uint *)(ptr->dataI).ptr; _green != (uint *)(pcVar3 + (long)(iVar1 * iVar2) * 4);
        _green = _green + 1) {
      fVar4 = saturate((float)*pix * 255.0);
      fVar5 = saturate((float)pix[1] * 255.0);
      fVar6 = saturate((float)pix[2] * 255.0);
      pix = pix + 4;
      *_green = (int)fVar4 << 0x10 | (int)fVar5 << 8 | (int)fVar6 | 0xff000000;
    }
  }
  return;
}

Assistant:

void CanvasCommit(Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		int *pStart = (int*)ptr->dataI.ptr, *pEnd = (int*)ptr->dataI.ptr + ptr->width * ptr->height;
		float *fStart = (float*)ptr->data.ptr;
		for(int *pix = pStart; pix != pEnd; pix++)
		{
			int red = int(saturate(*fStart++ * 255.0f));
			int green = int(saturate(*fStart++ * 255.0f));
			int blue = int(saturate(*fStart++ * 255.0f));
			fStart++;

			*pix = (red << 16) | (green << 8) | (blue) | (255 << 24);
		}
	}